

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TFunction * __thiscall
glslang::HlslParseContext::findFunction
          (HlslParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn,int *thisDepth,
          TIntermTyped **args)

{
  TSymbolTable *pTVar1;
  TIntermTyped **arguments;
  bool *pbVar2;
  TFunction *pTVar3;
  bool bVar4;
  int iVar5;
  TOperator TVar6;
  int iVar7;
  undefined4 extraout_var;
  TString *pTVar8;
  undefined4 extraout_var_00;
  size_type sVar9;
  reference ppTVar10;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar11;
  TSymbol *pTVar12;
  undefined4 extraout_var_01;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__rhs;
  TIntermUnary *this_00;
  undefined4 extraout_var_03;
  TIntermAggregate *this_01;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar14;
  TIntermTyped *pTVar15;
  undefined4 extraout_var_06;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar16;
  TType *pTVar17;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar18;
  undefined4 extraout_var_09;
  reference ppTVar19;
  undefined4 extraout_var_10;
  TType *pTVar20;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  uint local_3ac;
  undefined1 local_3a8 [4];
  int defParam;
  function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)> local_388
  ;
  TVector<const_glslang::TFunction_*> local_368;
  undefined1 local_348 [8];
  TParameter local_340;
  TParameter local_328;
  TParameter param;
  undefined1 local_2f8 [4];
  int arg;
  TFunction convertedCall;
  TIntermOperator *promote;
  function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)> local_170
  ;
  TVector<const_glslang::TFunction_*> local_150;
  function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)> local_130;
  function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)> local_110
  ;
  TVector<const_glslang::TFunction_*> local_f0;
  pool_allocator<char> local_d0;
  TString local_c8;
  TSymbol *local_a0;
  TSymbol *symbol_1;
  TFunction *bestMatch;
  undefined1 auStack_88 [6];
  bool tie;
  anon_class_1_0_00000001 better;
  anon_class_16_2_ddab9aaa convertible;
  undefined1 local_70 [3];
  bool allowOnlyUpConversions;
  TVector<const_glslang::TFunction_*> candidateList;
  TSymbol *symbol;
  TIntermTyped **ppTStack_40;
  bool dummyScope;
  TIntermTyped **args_local;
  int *thisDepth_local;
  bool *builtIn_local;
  TFunction *call_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_02;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  ppTStack_40 = args;
  args_local = (TIntermTyped **)thisDepth;
  thisDepth_local = (int *)builtIn;
  builtIn_local = (bool *)call;
  call_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  iVar5 = (*(call->super_TSymbol)._vptr_TSymbol[3])();
  bVar4 = TSymbolTable::isFunctionNameVariable(pTVar1,(TString *)CONCAT44(extraout_var,iVar5));
  pTVar3 = call_local;
  if (bVar4) {
    pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)builtIn_local + 0x18))();
    pcVar13 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                        (pbVar11);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar3,"can\'t use function syntax on variable",pcVar13,"");
    return (TFunction *)(HlslParseContext *)0x0;
  }
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  pTVar8 = (TString *)(**(code **)(*(long *)builtIn_local + 0x30))();
  candidateList.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)TSymbolTable::find(pTVar1,pTVar8,(bool *)thisDepth_local,(bool *)((long)&symbol + 7)
                                   ,(int *)args_local);
  if ((TSymbol *)
      candidateList.
      super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      .
      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (TSymbol *)0x0) {
    iVar5 = (*((TSymbol *)
              candidateList.
              super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              .
              super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_TSymbol[7])();
    return (TFunction *)(HlslParseContext *)CONCAT44(extraout_var_00,iVar5);
  }
  TVector<const_glslang::TFunction_*>::TVector((TVector<const_glslang::TFunction_*> *)local_70);
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  pTVar8 = (TString *)(**(code **)(*(long *)builtIn_local + 0x30))();
  TSymbolTable::findFunctionNameList
            (pTVar1,pTVar8,(TVector<const_glslang::TFunction_*> *)local_70,(bool *)thisDepth_local);
  sVar9 = std::
          vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>::
          size((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                *)local_70);
  if ((sVar9 == 1) && ((*thisDepth_local & 1) != 0)) {
    ppTVar10 = std::
               vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                             *)local_70,0);
    iVar5 = (*((*ppTVar10)->super_TSymbol)._vptr_TSymbol[0x1b])();
    if (iVar5 != 0x2d5) {
      ppTVar10 = std::
                 vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                 ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                               *)local_70,0);
      iVar5 = (*((*ppTVar10)->super_TSymbol)._vptr_TSymbol[0x1b])();
      if (iVar5 != 0x2d6) {
        ppTVar10 = std::
                   vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                                 *)local_70,0);
        iVar5 = (*((*ppTVar10)->super_TSymbol)._vptr_TSymbol[0x1b])();
        if (iVar5 != 0x2c9) {
          ppTVar10 = std::
                     vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                     ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                                   *)local_70,0);
          iVar5 = (*((*ppTVar10)->super_TSymbol)._vptr_TSymbol[0x1b])();
          if (iVar5 != 0x2ca) {
            ppTVar10 = std::
                       vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                       ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                                     *)local_70,0);
            iVar5 = (*((*ppTVar10)->super_TSymbol)._vptr_TSymbol[0x1b])();
            if (iVar5 != 0x2cb) goto LAB_005738cb;
          }
        }
      }
    }
    ppTVar10 = std::
               vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                             *)local_70,0);
    this_local = (HlslParseContext *)*ppTVar10;
  }
  else {
LAB_005738cb:
    convertible.this._3_1_ = 1;
    _auStack_88 = (bool *)((long)&convertible.this + 3);
    bestMatch._6_1_ = 0;
    symbol_1 = (TSymbol *)0x0;
    convertible.allowOnlyUpConversions = (bool *)this;
    pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)builtIn_local + 0x18))();
    bVar4 = std::operator==(pbVar11,"printf");
    if (bVar4) {
      pTVar1 = (this->super_TParseContextBase).symbolTable;
      pool_allocator<char>::pool_allocator(&local_d0);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_c8,"printf(",&local_d0);
      pTVar12 = TSymbolTable::find(pTVar1,&local_c8,(bool *)thisDepth_local,(bool *)0x0,(int *)0x0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_c8);
      local_a0 = pTVar12;
      if (pTVar12 != (TSymbol *)0x0) {
        iVar5 = (*pTVar12->_vptr_TSymbol[7])();
        this_local = (HlslParseContext *)CONCAT44(extraout_var_01,iVar5);
        goto LAB_0057426f;
      }
    }
    TVector<const_glslang::TFunction_*>::TVector
              (&local_f0,(TVector<const_glslang::TFunction_*> *)local_70);
    pbVar2 = builtIn_local;
    std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)>::
    function<glslang::HlslParseContext::findFunction(glslang::TSourceLoc_const&,glslang::TFunction&,bool&,int&,glslang::TIntermTyped*&)::__0_const&,void>
              ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)> *
               )&local_110,(anon_class_16_2_ddab9aaa *)auStack_88);
    std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)>::
    function<glslang::HlslParseContext::findFunction(glslang::TSourceLoc_const&,glslang::TFunction&,bool&,int&,glslang::TIntermTyped*&)::__1_const&,void>
              ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)> *)
               &local_130,(anon_class_1_0_00000001 *)((long)&bestMatch + 7));
    symbol_1 = &TParseContextBase::selectFunction
                          (&this->super_TParseContextBase,&local_f0,(TFunction *)pbVar2,&local_110,
                           &local_130,(bool *)((long)&bestMatch + 6))->super_TSymbol;
    std::function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>::
    ~function(&local_130);
    std::function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>::
    ~function(&local_110);
    TVector<const_glslang::TFunction_*>::~TVector(&local_f0);
    if (symbol_1 == (TSymbol *)0x0) {
      convertible.this._3_1_ = 0;
      TVector<const_glslang::TFunction_*>::TVector
                (&local_150,(TVector<const_glslang::TFunction_*> *)local_70);
      pbVar2 = builtIn_local;
      std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)>::
      function<glslang::HlslParseContext::findFunction(glslang::TSourceLoc_const&,glslang::TFunction&,bool&,int&,glslang::TIntermTyped*&)::__0_const&,void>
                ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)>
                  *)&local_170,(anon_class_16_2_ddab9aaa *)auStack_88);
      std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)>::
      function<glslang::HlslParseContext::findFunction(glslang::TSourceLoc_const&,glslang::TFunction&,bool&,int&,glslang::TIntermTyped*&)::__1_const&,void>
                ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)>
                  *)&promote,(anon_class_1_0_00000001 *)((long)&bestMatch + 7));
      symbol_1 = &TParseContextBase::selectFunction
                            (&this->super_TParseContextBase,&local_150,(TFunction *)pbVar2,
                             &local_170,
                             (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                              *)&promote,(bool *)((long)&bestMatch + 6))->super_TSymbol;
      std::function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>::
      ~function((function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                 *)&promote);
      std::function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>
      ::~function(&local_170);
      TVector<const_glslang::TFunction_*>::~TVector(&local_150);
    }
    pTVar3 = call_local;
    if (symbol_1 == (TSymbol *)0x0) {
      pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*(long *)builtIn_local + 0x18))();
      pcVar13 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (pbVar11);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar3,"no matching overloaded function found",pcVar13,"");
      this_local = (HlslParseContext *)0x0;
    }
    else {
      if ((*thisDepth_local & 1) != 0) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*(long *)builtIn_local + 0x30))();
        iVar5 = (*symbol_1->_vptr_TSymbol[6])();
        __rhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                CONCAT44(extraout_var_02,iVar5);
        bVar4 = std::operator==(pbVar11,__rhs);
        if (bVar4) {
          this_local = (HlslParseContext *)symbol_1;
          goto LAB_0057426f;
        }
        if (*ppTStack_40 != (TIntermTyped *)0x0) {
          convertedCall.linkType = ELinkNone;
          convertedCall._348_4_ = 0;
          iVar5 = (**(code **)(*(long *)builtIn_local + 0x120))();
          if (iVar5 == 1) {
            this_00 = (TIntermUnary *)TIntermNode::operator_new((TIntermNode *)0xf8,(size_t)__rhs);
            TVar6 = (*symbol_1->_vptr_TSymbol[0x1b])();
            TIntermUnary::TIntermUnary(this_00,TVar6);
            convertedCall._344_8_ = this_00;
            iVar5 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[7])();
            iVar7 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[3])();
            (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x180))
                      ((long *)CONCAT44(extraout_var_03,iVar5),iVar7);
          }
          else {
            this_01 = (TIntermAggregate *)
                      TIntermNode::operator_new((TIntermNode *)0x188,(size_t)__rhs);
            TVar6 = (*symbol_1->_vptr_TSymbol[0x1b])();
            TIntermAggregate::TIntermAggregate(this_01,TVar6);
            convertedCall._344_8_ = this_01;
            iVar5 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[6])();
            pvVar18 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 400))();
            iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[6])();
            pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 400))();
            std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::swap
                      (pvVar18,pvVar16);
          }
          bVar4 = TIntermediate::promote
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             (TIntermOperator *)convertedCall._344_8_);
          if (!bVar4) {
            this_local = (HlslParseContext *)0x0;
            goto LAB_0057426f;
          }
          iVar5 = (**(code **)(*(long *)builtIn_local + 0x120))();
          if (iVar5 == 1) {
            plVar14 = (long *)(**(code **)(*(long *)convertedCall._344_8_ + 0x38))();
            pTVar15 = (TIntermTyped *)(**(code **)(*plVar14 + 0x188))();
            *ppTStack_40 = pTVar15;
          }
          else {
            plVar14 = (long *)(**(code **)(*(long *)convertedCall._344_8_ + 0x30))();
            pvVar18 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (**(code **)(*plVar14 + 400))();
            iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[6])();
            pvVar16 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 400))();
            std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::swap
                      (pvVar18,pvVar16);
          }
        }
        pTVar8 = (TString *)(**(code **)(*(long *)builtIn_local + 0x18))();
        pTVar17 = (TType *)(**(code **)(*(long *)builtIn_local + 0x60))();
        TVar6 = (**(code **)(*(long *)builtIn_local + 0xd8))();
        TFunction::TFunction((TFunction *)local_2f8,pTVar8,pTVar17,TVar6);
        iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[6])();
        if (CONCAT44(extraout_var_07,iVar5) == 0) {
          iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[7])();
          if (CONCAT44(extraout_var_11,iVar5) == 0) {
            iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[3])();
            if (CONCAT44(extraout_var_13,iVar5) == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                            ,0x1e7e,
                            "const TFunction *glslang::HlslParseContext::findFunction(const TSourceLoc &, TFunction &, bool &, int &, TIntermTyped *&)"
                           );
            }
            local_348 = (undefined1  [8])0x0;
            pTVar17 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar8);
            TType::TType(pTVar17,EbtVoid,EvqTemporary,1,0,0,false);
            local_340.type = (TType *)0x0;
            local_340.name = (TString *)pTVar17;
            iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[3])();
            pTVar20 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_14,iVar5) + 0xf0))();
            TType::shallowCopy(pTVar17,pTVar20);
            TFunction::addParameter((TFunction *)local_2f8,(TParameter *)local_348);
          }
          else {
            local_340.defaultValue = (TIntermTyped *)0x0;
            pTVar17 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar8);
            TType::TType(pTVar17,EbtVoid,EvqTemporary,1,0,0,false);
            local_328.type = (TType *)0x0;
            local_328.name = (TString *)pTVar17;
            iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[7])();
            plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar5) + 0x188))();
            plVar14 = (long *)(**(code **)(*plVar14 + 0x18))();
            pTVar20 = (TType *)(**(code **)(*plVar14 + 0xf0))();
            TType::shallowCopy(pTVar17,pTVar20);
            TFunction::addParameter((TFunction *)local_2f8,(TParameter *)&local_340.defaultValue);
          }
        }
        else {
          param.defaultValue._4_4_ = 0;
          while( true ) {
            iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[6])();
            pvVar18 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 400))();
            sVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                              (pvVar18);
            if ((int)sVar9 <= param.defaultValue._4_4_) break;
            local_328.defaultValue = (TIntermTyped *)0x0;
            pTVar17 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar8);
            TType::TType(pTVar17,EbtVoid,EvqTemporary,1,0,0,false);
            iVar5 = (*((*ppTStack_40)->super_TIntermNode)._vptr_TIntermNode[6])();
            pvVar18 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar5) + 400))();
            ppTVar19 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                       operator[](pvVar18,(long)param.defaultValue._4_4_);
            iVar5 = (*(*ppTVar19)->_vptr_TIntermNode[3])();
            pTVar20 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar5) + 0xf0))();
            TType::shallowCopy(pTVar17,pTVar20);
            pTVar8 = (TString *)&local_328.defaultValue;
            TFunction::addParameter((TFunction *)local_2f8,(TParameter *)pTVar8);
            param.defaultValue._4_4_ = param.defaultValue._4_4_ + 1;
          }
        }
        TVector<const_glslang::TFunction_*>::TVector
                  (&local_368,(TVector<const_glslang::TFunction_*> *)local_70);
        std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)>::
        function<glslang::HlslParseContext::findFunction(glslang::TSourceLoc_const&,glslang::TFunction&,bool&,int&,glslang::TIntermTyped*&)::__0_const&,void>
                  ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TOperator,int)>
                    *)&local_388,(anon_class_16_2_ddab9aaa *)auStack_88);
        std::function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)>::
        function<glslang::HlslParseContext::findFunction(glslang::TSourceLoc_const&,glslang::TFunction&,bool&,int&,glslang::TIntermTyped*&)::__1_const&,void>
                  ((function<bool(glslang::TType_const&,glslang::TType_const&,glslang::TType_const&)>
                    *)local_3a8,(anon_class_1_0_00000001 *)((long)&bestMatch + 7));
        symbol_1 = &TParseContextBase::selectFunction
                              (&this->super_TParseContextBase,&local_368,(TFunction *)local_2f8,
                               &local_388,
                               (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                                *)local_3a8,(bool *)((long)&bestMatch + 6))->super_TSymbol;
        std::function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
        ::~function((function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                     *)local_3a8);
        std::
        function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>::
        ~function(&local_388);
        TVector<const_glslang::TFunction_*>::~TVector(&local_368);
        TFunction::~TFunction((TFunction *)local_2f8);
      }
      pTVar3 = call_local;
      if ((bestMatch._6_1_ & 1) != 0) {
        pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*(long *)builtIn_local + 0x18))();
        pcVar13 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (pbVar11);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar3,"ambiguous best function under implicit type conversion",pcVar13,"");
      }
      if (((bestMatch._6_1_ & 1) == 0) && (symbol_1 != (TSymbol *)0x0)) {
        for (local_3ac = (**(code **)(*(long *)builtIn_local + 0x120))();
            iVar5 = (*symbol_1->_vptr_TSymbol[0x24])(), pbVar2 = builtIn_local,
            arguments = ppTStack_40, (int)local_3ac < iVar5; local_3ac = local_3ac + 1) {
          iVar5 = (*symbol_1->_vptr_TSymbol[0x28])(symbol_1,(ulong)local_3ac);
          handleFunctionArgument
                    (this,(TFunction *)pbVar2,arguments,
                     *(TIntermTyped **)(CONCAT44(extraout_var_15,iVar5) + 0x10));
        }
      }
      this_local = (HlslParseContext *)symbol_1;
    }
  }
LAB_0057426f:
  convertible.this._4_4_ = 1;
  TVector<const_glslang::TFunction_*>::~TVector((TVector<const_glslang::TFunction_*> *)local_70);
  return (TFunction *)this_local;
}

Assistant:

const TFunction* HlslParseContext::findFunction(const TSourceLoc& loc, TFunction& call, bool& builtIn, int& thisDepth,
                                                TIntermTyped*& args)
{
    if (symbolTable.isFunctionNameVariable(call.getName())) {
        error(loc, "can't use function syntax on variable", call.getName().c_str(), "");
        return nullptr;
    }

    // first, look for an exact match
    bool dummyScope;
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn, &dummyScope, &thisDepth);
    if (symbol)
        return symbol->getAsFunction();

    // no exact match, use the generic selector, parameterized by the GLSL rules

    // create list of candidates to send
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    // These built-in ops can accept any type, so we bypass the argument selection
    if (candidateList.size() == 1 && builtIn &&
        (candidateList[0]->getBuiltInOp() == EOpMethodAppend ||
         candidateList[0]->getBuiltInOp() == EOpMethodRestartStrip ||
         candidateList[0]->getBuiltInOp() == EOpMethodIncrementCounter ||
         candidateList[0]->getBuiltInOp() == EOpMethodDecrementCounter ||
         candidateList[0]->getBuiltInOp() == EOpMethodConsume)) {
        return candidateList[0];
    }

    bool allowOnlyUpConversions = true;

    // can 'from' convert to 'to'?
    const auto convertible = [&](const TType& from, const TType& to, TOperator op, int arg) -> bool {
        if (from == to)
            return true;

        // no aggregate conversions
        if (from.isArray()  || to.isArray() ||
            from.isStruct() || to.isStruct())
            return false;

        switch (op) {
        case EOpInterlockedAdd:
        case EOpInterlockedAnd:
        case EOpInterlockedCompareExchange:
        case EOpInterlockedCompareStore:
        case EOpInterlockedExchange:
        case EOpInterlockedMax:
        case EOpInterlockedMin:
        case EOpInterlockedOr:
        case EOpInterlockedXor:
            // We do not promote the texture or image type for these ocodes.  Normally that would not
            // be an issue because it's a buffer, but we haven't decomposed the opcode yet, and at this
            // stage it's merely e.g, a basic integer type.
            //
            // Instead, we want to promote other arguments, but stay within the same family.  In other
            // words, InterlockedAdd(RWBuffer<int>, ...) will always use the int flavor, never the uint flavor,
            // but it is allowed to promote its other arguments.
            if (arg == 0)
                return false;
            break;
        case EOpMethodSample:
        case EOpMethodSampleBias:
        case EOpMethodSampleCmp:
        case EOpMethodSampleCmpLevelZero:
        case EOpMethodSampleGrad:
        case EOpMethodSampleLevel:
        case EOpMethodLoad:
        case EOpMethodGetDimensions:
        case EOpMethodGetSamplePosition:
        case EOpMethodGather:
        case EOpMethodCalculateLevelOfDetail:
        case EOpMethodCalculateLevelOfDetailUnclamped:
        case EOpMethodGatherRed:
        case EOpMethodGatherGreen:
        case EOpMethodGatherBlue:
        case EOpMethodGatherAlpha:
        case EOpMethodGatherCmp:
        case EOpMethodGatherCmpRed:
        case EOpMethodGatherCmpGreen:
        case EOpMethodGatherCmpBlue:
        case EOpMethodGatherCmpAlpha:
        case EOpMethodAppend:
        case EOpMethodRestartStrip:
            // those are method calls, the object type can not be changed
            // they are equal if the dim and type match (is dim sufficient?)
            if (arg == 0)
                return from.getSampler().type == to.getSampler().type &&
                       from.getSampler().arrayed == to.getSampler().arrayed &&
                       from.getSampler().shadow == to.getSampler().shadow &&
                       from.getSampler().ms == to.getSampler().ms &&
                       from.getSampler().dim == to.getSampler().dim;
            break;
        default:
            break;
        }

        // basic types have to be convertible
        if (allowOnlyUpConversions)
            if (! intermediate.canImplicitlyPromote(from.getBasicType(), to.getBasicType(), EOpFunctionCall))
                return false;

        // shapes have to be convertible
        if ((from.isScalarOrVec1() && to.isScalarOrVec1()) ||
            (from.isScalarOrVec1() && to.isVector())    ||
            (from.isScalarOrVec1() && to.isMatrix())    ||
            (from.isVector() && to.isVector() && from.getVectorSize() >= to.getVectorSize()))
            return true;

        // TODO: what are the matrix rules? they go here

        return false;
    };

    // Is 'to2' a better conversion than 'to1'?
    // Ties should not be considered as better.
    // Assumes 'convertible' already said true.
    const auto better = [](const TType& from, const TType& to1, const TType& to2) -> bool {
        // exact match is always better than mismatch
        if (from == to2)
            return from != to1;
        if (from == to1)
            return false;

        // shape changes are always worse
        if (from.isScalar() || from.isVector()) {
            if (from.getVectorSize() == to2.getVectorSize() &&
                from.getVectorSize() != to1.getVectorSize())
                return true;
            if (from.getVectorSize() == to1.getVectorSize() &&
                from.getVectorSize() != to2.getVectorSize())
                return false;
        }

        // Handle sampler betterness: An exact sampler match beats a non-exact match.
        // (If we just looked at basic type, all EbtSamplers would look the same).
        // If any type is not a sampler, just use the linearize function below.
        if (from.getBasicType() == EbtSampler && to1.getBasicType() == EbtSampler && to2.getBasicType() == EbtSampler) {
            // We can ignore the vector size in the comparison.
            TSampler to1Sampler = to1.getSampler();
            TSampler to2Sampler = to2.getSampler();

            to1Sampler.vectorSize = to2Sampler.vectorSize = from.getSampler().vectorSize;

            if (from.getSampler() == to2Sampler)
                return from.getSampler() != to1Sampler;
            if (from.getSampler() == to1Sampler)
                return false;
        }

        // Might or might not be changing shape, which means basic type might
        // or might not match, so within that, the question is how big a
        // basic-type conversion is being done.
        //
        // Use a hierarchy of domains, translated to order of magnitude
        // in a linearized view:
        //   - floating-point vs. integer
        //     - 32 vs. 64 bit (or width in general)
        //       - bool vs. non bool
        //         - signed vs. not signed
        const auto linearize = [](const TBasicType& basicType) -> int {
            switch (basicType) {
            case EbtBool:     return 1;
            case EbtInt:      return 10;
            case EbtUint:     return 11;
            case EbtInt64:    return 20;
            case EbtUint64:   return 21;
            case EbtFloat:    return 100;
            case EbtDouble:   return 110;
            default:          return 0;
            }
        };

        return abs(linearize(to2.getBasicType()) - linearize(from.getBasicType())) <
               abs(linearize(to1.getBasicType()) - linearize(from.getBasicType()));
    };

    // for ambiguity reporting
    bool tie = false;

    // send to the generic selector
    const TFunction* bestMatch = nullptr;

    // printf has var args and is in the symbol table as "printf()",
    // mangled to "printf("
    if (call.getName() == "printf") {
        TSymbol* symbol = symbolTable.find("printf(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    bestMatch = selectFunction(candidateList, call, convertible, better, tie);

    if (bestMatch == nullptr) {
        // If there is nothing selected by allowing only up-conversions (to a larger linearize() value),
        // we instead try down-conversions, which are valid in HLSL, but not preferred if there are any
        // upconversions possible.
        allowOnlyUpConversions = false;
        bestMatch = selectFunction(candidateList, call, convertible, better, tie);
    }

    if (bestMatch == nullptr) {
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");
        return nullptr;
    }

    // For built-ins, we can convert across the arguments.  This will happen in several steps:
    // Step 1:  If there's an exact match, use it.
    // Step 2a: Otherwise, get the operator from the best match and promote arguments:
    // Step 2b: reconstruct the TFunction based on the new arg types
    // Step 3:  Re-select after type promotion is applied, to find proper candidate.
    if (builtIn) {
        // Step 1: If there's an exact match, use it.
        if (call.getMangledName() == bestMatch->getMangledName())
            return bestMatch;

        // Step 2a: Otherwise, get the operator from the best match and promote arguments as if we
        // are that kind of operator.
        if (args != nullptr) {
            // The arg list can be a unary node, or an aggregate.  We have to handle both.
            // We will use the normal promote() facilities, which require an interm node.
            TIntermOperator* promote = nullptr;

            if (call.getParamCount() == 1) {
                promote = new TIntermUnary(bestMatch->getBuiltInOp());
                promote->getAsUnaryNode()->setOperand(args->getAsTyped());
            } else {
                promote = new TIntermAggregate(bestMatch->getBuiltInOp());
                promote->getAsAggregate()->getSequence().swap(args->getAsAggregate()->getSequence());
            }

            if (! intermediate.promote(promote))
                return nullptr;

            // Obtain the promoted arg list.
            if (call.getParamCount() == 1) {
                args = promote->getAsUnaryNode()->getOperand();
            } else {
                promote->getAsAggregate()->getSequence().swap(args->getAsAggregate()->getSequence());
            }
        }

        // Step 2b: reconstruct the TFunction based on the new arg types
        TFunction convertedCall(&call.getName(), call.getType(), call.getBuiltInOp());

        if (args->getAsAggregate()) {
            // Handle aggregates: put all args into the new function call
            for (int arg = 0; arg < int(args->getAsAggregate()->getSequence().size()); ++arg) {
                // TODO: But for constness, we could avoid the new & shallowCopy, and use the pointer directly.
                TParameter param = { nullptr, new TType, nullptr };
                param.type->shallowCopy(args->getAsAggregate()->getSequence()[arg]->getAsTyped()->getType());
                convertedCall.addParameter(param);
            }
        } else if (args->getAsUnaryNode()) {
            // Handle unaries: put all args into the new function call
            TParameter param = { nullptr, new TType, nullptr };
            param.type->shallowCopy(args->getAsUnaryNode()->getOperand()->getAsTyped()->getType());
            convertedCall.addParameter(param);
        } else if (args->getAsTyped()) {
            // Handle bare e.g, floats, not in an aggregate.
            TParameter param = { nullptr, new TType, nullptr };
            param.type->shallowCopy(args->getAsTyped()->getType());
            convertedCall.addParameter(param);
        } else {
            assert(0); // unknown argument list.
            return nullptr;
        }

        // Step 3: Re-select after type promotion, to find proper candidate
        // send to the generic selector
        bestMatch = selectFunction(candidateList, convertedCall, convertible, better, tie);

        // At this point, there should be no tie.
    }

    if (tie)
        error(loc, "ambiguous best function under implicit type conversion", call.getName().c_str(), "");

    // Append default parameter values if needed
    if (!tie && bestMatch != nullptr) {
        for (int defParam = call.getParamCount(); defParam < bestMatch->getParamCount(); ++defParam) {
            handleFunctionArgument(&call, args, (*bestMatch)[defParam].defaultValue);
        }
    }

    return bestMatch;
}